

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BBoxRenderCase::~BBoxRenderCase(BBoxRenderCase *this)

{
  pointer pIVar1;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BBoxRenderCase_00b587f8;
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
            (&(this->m_program).
              super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  ::reset(&(this->m_vbo).
           super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
         );
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::reset(&(this->m_fbo).
           super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
         );
  pIVar1 = (this->m_iterationConfigs).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pIVar1 != (pointer)0x0) {
    operator_delete(pIVar1,(long)(this->m_iterationConfigs).
                                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pIVar1);
  }
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::reset(&(this->m_fbo).
           super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
         );
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  ::reset(&(this->m_vbo).
           super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
         );
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
            (&(this->m_program).
              super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

BBoxRenderCase::~BBoxRenderCase (void)
{
	deinit();
}